

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

unsigned_short Extra_TruthPerm4One(uint uTruth,int Phase)

{
  uint local_24;
  uint local_20;
  uint uTruthRes;
  int iRes;
  int k;
  int i;
  int Phase_local;
  uint uTruth_local;
  
  if ((-1 < Phase) && (Phase < 0x10)) {
    if (Extra_TruthPerm4One::Cases[Phase] == 0) {
      Phase_local._2_2_ = (unsigned_short)uTruth;
    }
    else if (Extra_TruthPerm4One::Cases[Phase] < 2) {
      local_24 = 0;
      for (iRes = 0; iRes < 0x10; iRes = iRes + 1) {
        if ((uTruth & 1 << ((byte)iRes & 0x1f)) != 0) {
          local_20 = 0;
          for (uTruthRes = 0; (int)uTruthRes < 4; uTruthRes = uTruthRes + 1) {
            if ((iRes & 1 << ((byte)Extra_TruthPerm4One::Perms[Phase][(int)uTruthRes] & 0x1f)) != 0)
            {
              local_20 = 1 << ((byte)uTruthRes & 0x1f) | local_20;
            }
          }
          local_24 = 1 << ((byte)local_20 & 0x1f) | local_24;
        }
      }
      Phase_local._2_2_ = (unsigned_short)local_24;
    }
    else {
      Phase_local._2_2_ = Extra_TruthPerm4One::Cases[Phase];
    }
    return Phase_local._2_2_;
  }
  __assert_fail("Phase >= 0 && Phase < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x3b3,"unsigned short Extra_TruthPerm4One(unsigned int, int)");
}

Assistant:

unsigned short Extra_TruthPerm4One( unsigned uTruth, int Phase )
{
    // cases
    static unsigned short Cases[16] = {
        0,      // 0000  - skip
        0,      // 0001  - skip
        0xCCCC, // 0010  - single var
        0,      // 0011  - skip
        0xF0F0, // 0100  - single var
        1,      // 0101
        1,      // 0110
        0,      // 0111  - skip
        0xFF00, // 1000  - single var
        1,      // 1001
        1,      // 1010
        1,      // 1011
        1,      // 1100
        1,      // 1101
        1,      // 1110
        0       // 1111  - skip
    };
    // permutations
    static int Perms[16][4] = {
        { 0, 0, 0, 0 }, // 0000  - skip
        { 0, 0, 0, 0 }, // 0001  - skip
        { 0, 0, 0, 0 }, // 0010  - single var
        { 0, 0, 0, 0 }, // 0011  - skip
        { 0, 0, 0, 0 }, // 0100  - single var
        { 0, 2, 1, 3 }, // 0101
        { 2, 0, 1, 3 }, // 0110
        { 0, 0, 0, 0 }, // 0111  - skip
        { 0, 0, 0, 0 }, // 1000  - single var
        { 0, 2, 3, 1 }, // 1001
        { 2, 0, 3, 1 }, // 1010
        { 0, 1, 3, 2 }, // 1011
        { 2, 3, 0, 1 }, // 1100
        { 0, 3, 1, 2 }, // 1101
        { 3, 0, 1, 2 }, // 1110
        { 0, 0, 0, 0 }  // 1111  - skip
    };
    int i, k, iRes;
    unsigned uTruthRes;
    assert( Phase >= 0 && Phase < 16 );
    if ( Cases[Phase] == 0 )
        return uTruth;
    if ( Cases[Phase] > 1 )
        return Cases[Phase];
    uTruthRes = 0;
    for ( i = 0; i < 16; i++ )
        if ( uTruth & (1 << i) )
        {
            for ( iRes = 0, k = 0; k < 4; k++ )
                if ( i & (1 << Perms[Phase][k]) )
                    iRes |= (1 << k);
            uTruthRes |= (1 << iRes);
        }
    return uTruthRes;
}